

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O1

void __thiscall
libcellml::Validator::ValidatorImpl::validateUnits
          (ValidatorImpl *this,UnitsPtr *units,History *history,
          vector<std::shared_ptr<libcellml::Model>,_std::allocator<std::shared_ptr<libcellml::Model>_>_>
          *modelsVisited,string *sourceUrl)

{
  pointer *ppbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer *ppvVar3;
  pointer *ppbVar4;
  pointer psVar5;
  IssueImpl *pIVar6;
  pointer psVar7;
  pointer psVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  pointer psVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  bool bVar11;
  int iVar12;
  ReferenceRule RVar13;
  long *plVar14;
  size_t initialErrorCount;
  size_t sVar15;
  size_t sVar16;
  size_type *psVar17;
  element_type *peVar18;
  pointer pvVar19;
  element_type *peVar20;
  pointer pbVar21;
  size_t i;
  ulong uVar22;
  ulong uVar23;
  _Alloc_hider name;
  pointer pbVar24;
  undefined8 uVar25;
  ValidatorImpl *pVVar26;
  UnitsPtr *units_00;
  ulong uVar27;
  pointer psVar28;
  pointer *ppbVar29;
  ulong uVar30;
  Strings names;
  UnitsPtr tmpUnits;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  Strings importUnitsRefs;
  Strings importUnitsNames;
  IssuePtr issue_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  UnitsPtr *local_1c8;
  ValidatorImpl *local_1c0;
  string unitsRef;
  string unitsName;
  IssuesList importIssueList;
  string unitsImportUrl;
  IssuePtr issue;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  string local_118;
  HistoryEpochPtr h;
  ModelPtr model;
  IssuePtr issue_8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  IssuePtr issue_4;
  ImportSourcePtr importSource;
  element_type *local_90;
  UnitsPtr importedUnits;
  ModelPtr importSourceModel;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  unitsRef._M_dataplus._M_p =
       (pointer)(units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  unitsRef._M_string_length =
       (size_type)
       (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unitsRef._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unitsRef._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unitsRef._M_string_length)->_M_use_count
           + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unitsRef._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unitsRef._M_string_length)->_M_use_count
           + 1;
    }
  }
  paVar2 = &unitsName.field_2;
  unitsName._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&unitsName,"");
  createHistoryEpoch((libcellml *)&h,(UnitsConstPtr *)&unitsRef,sourceUrl,&unitsName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)unitsName._M_dataplus._M_p != paVar2) {
    operator_delete(unitsName._M_dataplus._M_p,
                    CONCAT71(unitsName.field_2._M_allocated_capacity._1_7_,
                             unitsName.field_2._M_local_buf[0]) + 1);
  }
  if (unitsRef._M_string_length != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)unitsRef._M_string_length);
  }
  bVar11 = checkForLocalCycles(history,&h);
  local_1c8 = units;
  local_1c0 = this;
  if (bVar11) {
    std::
    vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
    ::push_back(history,&h);
    unitsName._M_string_length = 0;
    unitsName.field_2._M_local_buf[0] = '\0';
    names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    psVar28 = (history->
              super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    psVar5 = (history->
             super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    unitsName._M_dataplus._M_p = (pointer)paVar2;
    if (psVar28 != psVar5) {
      do {
        if (unitsName._M_string_length != 0) {
          std::__cxx11::string::append((char *)&unitsName);
        }
        std::operator+(&unitsImportUrl,"\'",
                       &((psVar28->
                         super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->mName);
        plVar14 = (long *)std::__cxx11::string::append((char *)&unitsImportUrl);
        psVar17 = (size_type *)(plVar14 + 2);
        if ((size_type *)*plVar14 == psVar17) {
          unitsRef.field_2._M_allocated_capacity = *psVar17;
          unitsRef.field_2._8_8_ = plVar14[3];
          unitsRef._M_dataplus._M_p = (pointer)&unitsRef.field_2;
        }
        else {
          unitsRef.field_2._M_allocated_capacity = *psVar17;
          unitsRef._M_dataplus._M_p = (pointer)*plVar14;
        }
        unitsRef._M_string_length = plVar14[1];
        *plVar14 = (long)psVar17;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)unitsImportUrl._M_dataplus._M_p != &unitsImportUrl.field_2) {
          operator_delete(unitsImportUrl._M_dataplus._M_p,
                          CONCAT71(unitsImportUrl.field_2._M_allocated_capacity._1_7_,
                                   unitsImportUrl.field_2._M_local_buf[0]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&names,&unitsRef);
        std::__cxx11::string::_M_append((char *)&unitsName,(ulong)unitsRef._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)unitsRef._M_dataplus._M_p != &unitsRef.field_2) {
          operator_delete(unitsRef._M_dataplus._M_p,unitsRef.field_2._M_allocated_capacity + 1);
        }
        psVar28 = psVar28 + 1;
      } while (psVar28 != psVar5);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,&names);
    pVVar26 = local_1c0;
    bVar11 = hasCycleAlreadyBeenReported(local_1c0,&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    if (!bVar11) {
      Issue::IssueImpl::create();
      pIVar6 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl;
      std::operator+(&unitsImportUrl,"Cyclic units exist: ",&unitsName);
      plVar14 = (long *)std::__cxx11::string::append((char *)&unitsImportUrl);
      psVar17 = (size_type *)(plVar14 + 2);
      if ((size_type *)*plVar14 == psVar17) {
        unitsRef.field_2._M_allocated_capacity = *psVar17;
        unitsRef.field_2._8_8_ = plVar14[3];
        unitsRef._M_dataplus._M_p = (pointer)&unitsRef.field_2;
      }
      else {
        unitsRef.field_2._M_allocated_capacity = *psVar17;
        unitsRef._M_dataplus._M_p = (pointer)*plVar14;
      }
      unitsRef._M_string_length = plVar14[1];
      *plVar14 = (long)psVar17;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      Issue::IssueImpl::setDescription(pIVar6,&unitsRef);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)unitsRef._M_dataplus._M_p != &unitsRef.field_2) {
        operator_delete(unitsRef._M_dataplus._M_p,unitsRef.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)unitsImportUrl._M_dataplus._M_p != &unitsImportUrl.field_2) {
        operator_delete(unitsImportUrl._M_dataplus._M_p,
                        CONCAT71(unitsImportUrl.field_2._M_allocated_capacity._1_7_,
                                 unitsImportUrl.field_2._M_local_buf[0]) + 1);
      }
      AnyCellmlElement::AnyCellmlElementImpl::setUnits
                ((((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   mPimpl->mItem).
                  super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->mPimpl,local_1c8);
      Issue::IssueImpl::setReferenceRule
                ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl,UNIT_UNITS_CIRCULAR_REFERENCE);
      Logger::LoggerImpl::addIssue(&pVVar26->super_LoggerImpl,&issue);
      if (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    psVar28 = (history->
              super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    (history->
    super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = psVar28 + -1;
    p_Var9 = psVar28[-1].super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&names);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)unitsName._M_dataplus._M_p == &unitsName.field_2) goto LAB_002722d2;
  }
  else {
    NamedEntity::name_abi_cxx11_
              (&unitsName,
               &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_NamedEntity);
    initialErrorCount = Logger::issueCount(&this->mValidator->super_Logger);
    psVar7 = (modelsVisited->
             super__Vector_base<std::shared_ptr<libcellml::Model>,_std::allocator<std::shared_ptr<libcellml::Model>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    psVar8 = (modelsVisited->
             super__Vector_base<std::shared_ptr<libcellml::Model>,_std::allocator<std::shared_ptr<libcellml::Model>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    unitsRef._M_dataplus._M_p = (pointer)&unitsRef.field_2;
    unitsRef._M_string_length = 0;
    unitsRef.field_2._M_allocated_capacity =
         unitsRef.field_2._M_allocated_capacity & 0xffffffffffffff00;
    unitsImportUrl._M_dataplus._M_p = (pointer)&unitsImportUrl.field_2;
    unitsImportUrl._M_string_length = 0;
    unitsImportUrl.field_2._M_local_buf[0] = '\0';
    bVar11 = ImportedEntity::isImport
                       (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->super_ImportedEntity);
    if (bVar11) {
      ImportedEntity::importReference_abi_cxx11_
                ((string *)&names,
                 &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->super_ImportedEntity);
      std::__cxx11::string::operator=((string *)&unitsRef,(string *)&names);
      ppbVar29 = &names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar29) {
        operator_delete(names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((names.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      ImportedEntity::importSource
                (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->super_ImportedEntity);
      ImportSource::url_abi_cxx11_
                ((string *)&names,
                 (ImportSource *)
                 issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      std::__cxx11::string::operator=((string *)&unitsImportUrl,(string *)&names);
      if (names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar29) {
        operator_delete(names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((names.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::__cxx11::string::_M_assign
                ((string *)
                 &(h.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->mReferenceName);
      ImportedEntity::importSource
                (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->super_ImportedEntity);
      ImportSource::url_abi_cxx11_
                ((string *)&issue,
                 (ImportSource *)
                 tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      importeeModelUrl((string *)&names,history,(string *)&issue);
      std::__cxx11::string::operator=
                ((string *)
                 &(h.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->mSourceUrl,(string *)&names);
      if (names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar29) {
        operator_delete(names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((names.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          &local_128) {
        operator_delete(issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,local_128._M_allocated_capacity + 1);
      }
      if (tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)(units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
    if (names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->_M_string_length =
             (int)(names.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->_M_string_length + 1;
        UNLOCK();
      }
      else {
        *(int *)&(names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->_M_string_length =
             (int)(names.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->_M_string_length + 1;
      }
    }
    name._M_p = (pointer)&names;
    owningModel((ParentedEntityConstPtr *)&model);
    if (names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    local_90 = (element_type *)0x0;
    uVar23 = 0;
    uVar22 = 0;
    while( true ) {
      ppbVar29 = &names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      sVar15 = Model::unitsCount(model.
                                 super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
      units_00 = local_1c8;
      if ((sVar15 <= uVar22) ||
         ((long)(modelsVisited->
                super__Vector_base<std::shared_ptr<libcellml::Model>,_std::allocator<std::shared_ptr<libcellml::Model>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(modelsVisited->
                super__Vector_base<std::shared_ptr<libcellml::Model>,_std::allocator<std::shared_ptr<libcellml::Model>_>_>
                )._M_impl.super__Vector_impl_data._M_start != 0x10)) break;
      Model::units((Model *)&tmpUnits,
                   (size_t)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
      name._M_p = (pointer)tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr;
      NamedEntity::name_abi_cxx11_
                ((string *)&names,
                 &(tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->super_NamedEntity);
      if (names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == (pointer)unitsName._M_string_length) {
        if (names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
          uVar27 = 1;
        }
        else {
          name = unitsName._M_dataplus;
          iVar12 = bcmp(names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,unitsName._M_dataplus._M_p,
                        (size_t)names.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
          uVar27 = (ulong)(iVar12 == 0);
        }
      }
      else {
        uVar27 = 0;
      }
      if (names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar29) {
        name._M_p = (pointer)((long)&((names.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1);
        operator_delete(names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,(ulong)name._M_p);
      }
      bVar11 = ImportedEntity::isImport
                         (&(tmpUnits.
                            super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->super_ImportedEntity);
      if (bVar11) {
        name._M_p = (pointer)&(tmpUnits.
                               super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->super_ImportedEntity;
        ImportedEntity::importReference_abi_cxx11_((string *)&names,(ImportedEntity *)name._M_p);
        if (names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish == (pointer)unitsRef._M_string_length) {
          if (names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
            bVar11 = true;
          }
          else {
            name = unitsRef._M_dataplus;
            iVar12 = bcmp(names.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,unitsRef._M_dataplus._M_p,
                          (size_t)names.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish);
            bVar11 = iVar12 == 0;
          }
        }
        else {
          bVar11 = false;
        }
        if (bVar11) {
          ImportedEntity::importSource
                    (&(tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->super_ImportedEntity);
          name._M_p = (pointer)local_58;
          ImportSource::url_abi_cxx11_((string *)&issue,(ImportSource *)local_58);
          if (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       unitsImportUrl._M_string_length) goto LAB_00272079;
          if (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            uVar30 = 1;
          }
          else {
            name = unitsImportUrl._M_dataplus;
            iVar12 = bcmp(issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,unitsImportUrl._M_dataplus._M_p,
                          (size_t)issue.
                                  super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi);
            uVar30 = (ulong)(iVar12 == 0);
          }
        }
        else {
LAB_00272079:
          uVar30 = 0;
        }
        if (bVar11) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_128) {
            name._M_p = (pointer)(local_128._M_allocated_capacity + 1);
            operator_delete(issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,(ulong)name._M_p);
          }
          if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
          }
        }
        if (names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          name._M_p = (pointer)((long)&((names.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1);
          operator_delete(names.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,(ulong)name._M_p);
        }
        uVar23 = uVar23 + uVar30;
      }
      if (tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_90 = (element_type *)
                 ((long)&(local_90->super_NamedEntity).super_ParentedEntity.super_Entity.
                         _vptr_Entity + uVar27);
      uVar22 = uVar22 + 1;
    }
    bVar11 = ImportedEntity::isImport
                       (&((local_1c8->
                          super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                         ->super_ImportedEntity);
    pVVar26 = local_1c0;
    if (bVar11) {
      sVar15 = Logger::issueCount(&local_1c0->mValidator->super_Logger);
      RVar13 = validateCellmlIdentifier(&unitsRef);
      if (RVar13 != UNDEFINED) {
        makeIssueIllegalIdentifier((ValidatorImpl *)&issue_1,(string *)name._M_p);
        pIVar6 = (issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &importUnitsNames,"Imported units \'",&unitsName);
        plVar14 = (long *)std::__cxx11::string::append((char *)&importUnitsNames);
        peVar18 = (element_type *)(plVar14 + 2);
        if ((element_type *)*plVar14 == peVar18) {
          local_238._M_allocated_capacity =
               (size_type)
               (peVar18->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
          local_238._8_8_ = plVar14[3];
          tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&local_238;
        }
        else {
          local_238._M_allocated_capacity =
               (size_type)
               (peVar18->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
          tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)*plVar14;
        }
        tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar14[1];
        *plVar14 = (long)peVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        Issue::description_abi_cxx11_
                  ((string *)&importUnitsRefs,
                   issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        pbVar21 = (pointer)((long)&(tmpUnits.
                                    super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base +
                           (long)&(importUnitsRefs.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus);
        uVar25 = (pointer)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            &local_238) {
          uVar25 = local_238._M_allocated_capacity;
        }
        if ((ulong)uVar25 < pbVar21) {
          pbVar24 = (pointer)0xf;
          if (importUnitsRefs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pointer)&importUnitsRefs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            pbVar24 = importUnitsRefs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          if (pbVar24 < pbVar21) goto LAB_00272368;
          plVar14 = (long *)std::__cxx11::string::replace
                                      ((ulong)&importUnitsRefs,0,(char *)0x0,
                                       (ulong)tmpUnits.
                                              super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr);
        }
        else {
LAB_00272368:
          plVar14 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&tmpUnits,
                                       (ulong)importUnitsRefs.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
        }
        pbVar21 = (pointer)(plVar14 + 2);
        if ((pointer)*plVar14 == pbVar21) {
          names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar21->_M_dataplus)._M_p;
          names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar29;
        }
        else {
          names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar21->_M_dataplus)._M_p;
          names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar14;
        }
        names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar14[1];
        *plVar14 = (long)pbVar21;
        plVar14[1] = 0;
        *(undefined1 *)&(pbVar21->_M_dataplus)._M_p = 0;
        Issue::IssueImpl::setDescription(pIVar6,(string *)&names);
        if (names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar29) {
          operator_delete(names.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((names.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
        }
        if (importUnitsRefs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&importUnitsRefs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(importUnitsRefs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((importUnitsRefs.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            &local_238) {
          operator_delete(tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,(ulong)(local_238._M_allocated_capacity + 1));
        }
        if (importUnitsNames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&importUnitsNames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(importUnitsNames.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((importUnitsNames.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
        }
        AnyCellmlElement::AnyCellmlElementImpl::setUnits
                  ((((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl->mItem).
                    super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->mPimpl,local_1c8);
        Issue::IssueImpl::setReferenceRule
                  ((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->mPimpl,IMPORT_UNITS_UNITS_REFERENCE_VALUE);
        Logger::LoggerImpl::addIssue(&local_1c0->super_LoggerImpl,&issue_1);
        if (issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      ImportedEntity::importSource
                (&((local_1c8->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->super_ImportedEntity);
      names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar29;
      std::__cxx11::string::_M_construct<char_const*>((string *)&names,"units","");
      validateImportSource(local_1c0,&importSource,&unitsName,(string *)&names);
      if (names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar29) {
        operator_delete(names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((names.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      sVar16 = Logger::issueCount(&local_1c0->mValidator->super_Logger);
      pVVar26 = local_1c0;
      units_00 = local_1c8;
      if ((sVar16 <= sVar15) && (1 < uVar23)) {
        NamedEntity::name_abi_cxx11_
                  (&local_118,
                   (NamedEntity *)
                   model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,0x2b4469);
        ppvVar3 = &importIssueList.
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pvVar19 = (pointer)(plVar14 + 2);
        if ((pointer)*plVar14 == pvVar19) {
          importIssueList.
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)(pvVar19->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
          importIssueList.
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)ppvVar3;
        }
        else {
          importIssueList.
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)(pvVar19->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
          importIssueList.
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar14;
        }
        importIssueList.
        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar14[1];
        *plVar14 = (long)pvVar19;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&importIssueList);
        peVar20 = (element_type *)(plVar14 + 2);
        if ((element_type *)*plVar14 == peVar20) {
          local_1d8._M_allocated_capacity = (size_type)peVar20->_vptr_Issue;
          local_1d8._8_8_ = plVar14[3];
          issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&local_1d8;
        }
        else {
          local_1d8._M_allocated_capacity = (size_type)peVar20->_vptr_Issue;
          issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)*plVar14;
        }
        issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar14[1];
        *plVar14 = (long)peVar20;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&issue_1,(ulong)unitsImportUrl._M_dataplus._M_p);
        ppbVar1 = &importUnitsRefs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pbVar21 = (pointer)(plVar14 + 2);
        if ((pointer)*plVar14 == pbVar21) {
          importUnitsRefs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar21->_M_dataplus)._M_p;
          importUnitsRefs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
        }
        else {
          importUnitsRefs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar21->_M_dataplus)._M_p;
          importUnitsRefs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar14;
        }
        importUnitsRefs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar14[1];
        *plVar14 = (long)pbVar21;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&importUnitsRefs);
        ppbVar4 = &importUnitsNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pbVar21 = (pointer)(plVar14 + 2);
        if ((pointer)*plVar14 == pbVar21) {
          importUnitsNames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar21->_M_dataplus)._M_p;
          importUnitsNames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar4;
        }
        else {
          importUnitsNames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar21->_M_dataplus)._M_p;
          importUnitsNames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar14;
        }
        importUnitsNames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar14[1];
        *plVar14 = (long)pbVar21;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&importUnitsNames,(ulong)unitsRef._M_dataplus._M_p);
        peVar18 = (element_type *)(plVar14 + 2);
        if ((element_type *)*plVar14 == peVar18) {
          local_238._M_allocated_capacity =
               (size_type)
               (peVar18->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
          local_238._8_8_ = plVar14[3];
          tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&local_238;
        }
        else {
          local_238._M_allocated_capacity =
               (size_type)
               (peVar18->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
          tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)*plVar14;
        }
        tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar14[1];
        *plVar14 = (long)peVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&tmpUnits);
        pbVar21 = (pointer)(plVar14 + 2);
        if ((pointer)*plVar14 == pbVar21) {
          names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar21->_M_dataplus)._M_p;
          names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar29;
        }
        else {
          names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar21->_M_dataplus)._M_p;
          names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar14;
        }
        names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar14[1];
        *plVar14 = (long)pbVar21;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            &local_238) {
          operator_delete(tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,(ulong)(local_238._M_allocated_capacity + 1));
        }
        if (importUnitsNames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar4) {
          operator_delete(importUnitsNames.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((importUnitsNames.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
        }
        if (importUnitsRefs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
          operator_delete(importUnitsRefs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((importUnitsRefs.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
        }
        pVVar26 = local_1c0;
        units_00 = local_1c8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            &local_1d8) {
          operator_delete(issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,local_1d8._M_allocated_capacity + 1);
        }
        if (importIssueList.
            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)ppvVar3) {
          operator_delete(importIssueList.
                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((importIssueList.
                                           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,
                          (ulong)(local_118.field_2._M_allocated_capacity + 1));
        }
        bVar11 = checkIssuesForDuplications(pVVar26,(string *)&names);
        if (!bVar11) {
          Issue::IssueImpl::create();
          Issue::IssueImpl::setDescription
                    ((IssueImpl *)
                     ((tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,
                     (string *)&names);
          AnyCellmlElement::AnyCellmlElementImpl::setModel
                    (*(AnyCellmlElementImpl **)
                      ((tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl[1].mId.
                      _M_string_length,&model,MODEL);
          Issue::IssueImpl::setReferenceRule
                    ((IssueImpl *)
                     ((tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,
                     IMPORT_UNITS_UNITS_REFERENCE);
          Logger::LoggerImpl::addIssue(&pVVar26->super_LoggerImpl,(IssuePtr *)&tmpUnits);
          if (tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        if (names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar29) {
          operator_delete(names.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((names.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
        }
      }
      ImportSource::model((ImportSource *)&importSourceModel);
      name._M_p = (pointer)importSourceModel.
                           super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (importSourceModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        Model::units((Model *)&importedUnits,
                     (string *)
                     importSourceModel.
                     super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if (importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          Issue::IssueImpl::create();
          pIVar6 = (issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->mPimpl;
          NamedEntity::name_abi_cxx11_
                    (&local_118,
                     &((local_1c8->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)
                      ._M_ptr)->super_NamedEntity);
          plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,0x2b6263);
          ppvVar3 = &importIssueList.
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pvVar19 = (pointer)(plVar14 + 2);
          if ((pointer)*plVar14 == pvVar19) {
            importIssueList.
            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)(pvVar19->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
            importIssueList.
            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)ppvVar3;
          }
          else {
            importIssueList.
            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)(pvVar19->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
            importIssueList.
            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar14;
          }
          importIssueList.
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar14[1];
          *plVar14 = (long)pvVar19;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          plVar14 = (long *)std::__cxx11::string::append((char *)&importIssueList);
          issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&local_1d8;
          peVar20 = (element_type *)(plVar14 + 2);
          if ((element_type *)*plVar14 == peVar20) {
            local_1d8._M_allocated_capacity = (size_type)peVar20->_vptr_Issue;
            local_1d8._8_8_ = plVar14[3];
          }
          else {
            local_1d8._M_allocated_capacity = (size_type)peVar20->_vptr_Issue;
            issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*plVar14;
          }
          issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar14[1];
          *plVar14 = (long)peVar20;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          plVar14 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&issue_1,(ulong)unitsRef._M_dataplus._M_p);
          ppbVar1 = &importUnitsRefs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pbVar21 = (pointer)(plVar14 + 2);
          if ((pointer)*plVar14 == pbVar21) {
            importUnitsRefs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)(pbVar21->_M_dataplus)._M_p;
            importUnitsRefs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
          }
          else {
            importUnitsRefs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)(pbVar21->_M_dataplus)._M_p;
            importUnitsRefs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar14;
          }
          importUnitsRefs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar14[1];
          *plVar14 = (long)pbVar21;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          plVar14 = (long *)std::__cxx11::string::append((char *)&importUnitsRefs);
          ppbVar4 = &importUnitsNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pbVar21 = (pointer)(plVar14 + 2);
          if ((pointer)*plVar14 == pbVar21) {
            importUnitsNames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)(pbVar21->_M_dataplus)._M_p;
            importUnitsNames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar4;
          }
          else {
            importUnitsNames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)(pbVar21->_M_dataplus)._M_p;
            importUnitsNames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar14;
          }
          importUnitsNames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar14[1];
          *plVar14 = (long)pbVar21;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          ImportSource::url_abi_cxx11_
                    ((string *)&issue_8,
                     importSource.
                     super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          pbVar21 = (pointer)((long)&((importUnitsNames.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                     _M_p +
                             (long)&(issue_8.
                                     super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi)->_vptr__Sp_counted_base);
          pbVar24 = (pointer)0xf;
          if (importUnitsNames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar4) {
            pbVar24 = importUnitsNames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          if (pbVar24 < pbVar21) {
            uVar25 = (pointer)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)issue_8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                != &local_c0) {
              uVar25 = local_c0._M_allocated_capacity;
            }
            if ((ulong)uVar25 < pbVar21) goto LAB_00272d46;
            plVar14 = (long *)std::__cxx11::string::replace
                                        ((ulong)&issue_8,0,(char *)0x0,
                                         (ulong)importUnitsNames.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
          }
          else {
LAB_00272d46:
            plVar14 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&importUnitsNames,
                                         (ulong)issue_8.
                                                super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr);
          }
          tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&local_238;
          peVar18 = (element_type *)(plVar14 + 2);
          if ((element_type *)*plVar14 == peVar18) {
            local_238._M_allocated_capacity =
                 (size_type)
                 (peVar18->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
            local_238._8_8_ = plVar14[3];
          }
          else {
            local_238._M_allocated_capacity =
                 (size_type)
                 (peVar18->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
            tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*plVar14;
          }
          tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar14[1];
          *plVar14 = (long)peVar18;
          plVar14[1] = 0;
          *(undefined1 *)
           &(peVar18->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity = 0;
          plVar14 = (long *)std::__cxx11::string::append((char *)&tmpUnits);
          pbVar21 = (pointer)(plVar14 + 2);
          if ((pointer)*plVar14 == pbVar21) {
            names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)(pbVar21->_M_dataplus)._M_p;
            names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar29;
          }
          else {
            names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)(pbVar21->_M_dataplus)._M_p;
            names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar14;
          }
          names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar14[1];
          *plVar14 = (long)pbVar21;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          Issue::IssueImpl::setDescription(pIVar6,(string *)&names);
          pVVar26 = local_1c0;
          units_00 = local_1c8;
          if (names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar29) {
            operator_delete(names.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&((names.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           _M_dataplus)._M_p + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_238) {
            operator_delete(tmpUnits.
                            super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (ulong)(local_238._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)issue_8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_c0) {
            operator_delete(issue_8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,(ulong)(local_c0._M_allocated_capacity + 1));
          }
          if (importUnitsNames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar4) {
            operator_delete(importUnitsNames.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&((importUnitsNames.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           _M_dataplus)._M_p + 1));
          }
          if (importUnitsRefs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
            operator_delete(importUnitsRefs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&((importUnitsRefs.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           _M_dataplus)._M_p + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_1d8) {
            operator_delete(issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,local_1d8._M_allocated_capacity + 1);
          }
          if (importIssueList.
              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)ppvVar3) {
            operator_delete(importIssueList.
                            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&((importIssueList.
                                             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,
                            (ulong)(local_118.field_2._M_allocated_capacity + 1));
          }
          AnyCellmlElement::AnyCellmlElementImpl::setUnits
                    ((((issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl->mItem).
                      super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,units_00);
          Issue::IssueImpl::setReferenceRule
                    ((issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,IMPORT_UNITS_UNITS_REFERENCE_VALUE_TARGET);
          name._M_p = (pointer)&issue_4;
          Logger::LoggerImpl::addIssue(&pVVar26->super_LoggerImpl,(IssuePtr *)name._M_p);
          if (issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        else {
          importUnitsNames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          importUnitsNames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          importUnitsNames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          importUnitsRefs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          importUnitsRefs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          importUnitsRefs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1d8._M_allocated_capacity = 0;
          issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          importIssueList.
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          importIssueList.
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          importIssueList.
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          bVar11 = checkForImportCycles(history,&h);
          if (bVar11) {
            std::
            vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
            ::push_back(history,&h);
            tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)&local_238;
            std::__cxx11::string::_M_construct<char_const*>((string *)&tmpUnits,"resolve","");
            formDescriptionOfCyclicDependency((string *)&names,history,(string *)&tmpUnits);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                != &local_238) {
              operator_delete(tmpUnits.
                              super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,(ulong)(local_238._M_allocated_capacity + 1));
            }
            Issue::IssueImpl::create();
            Issue::IssueImpl::setDescription
                      ((IssueImpl *)
                       ((tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,
                       (string *)&names);
            AnyCellmlElement::AnyCellmlElementImpl::setUnits
                      (*(AnyCellmlElementImpl **)
                        ((tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl[1].mId
                        ._M_string_length,units_00);
            Issue::IssueImpl::setReferenceRule
                      ((IssueImpl *)
                       ((tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,
                       IMPORT_UNITS_UNITS_REFERENCE);
            name._M_p = (pointer)&tmpUnits;
            Logger::LoggerImpl::addIssue(&pVVar26->super_LoggerImpl,(IssuePtr *)name._M_p);
            if (tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar29) {
              name._M_p = (pointer)((long)&((names.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           _M_dataplus)._M_p + 1);
              operator_delete(names.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,(ulong)name._M_p);
            }
          }
          else {
            std::
            vector<std::shared_ptr<libcellml::Model>,_std::allocator<std::shared_ptr<libcellml::Model>_>_>
            ::push_back(modelsVisited,&importSourceModel);
            std::
            vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
            ::push_back(history,&h);
            ImportSource::url_abi_cxx11_
                      ((string *)&names,
                       importSource.
                       super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            name._M_p = (pointer)&importedUnits;
            validateUnits(pVVar26,(UnitsPtr *)name._M_p,history,modelsVisited,(string *)&names);
            if (names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar29) {
              name._M_p = (pointer)((long)&((names.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           _M_dataplus)._M_p + 1);
              operator_delete(names.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,(ulong)name._M_p);
            }
            psVar10 = (modelsVisited->
                      super__Vector_base<std::shared_ptr<libcellml::Model>,_std::allocator<std::shared_ptr<libcellml::Model>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            (modelsVisited->
            super__Vector_base<std::shared_ptr<libcellml::Model>,_std::allocator<std::shared_ptr<libcellml::Model>_>_>
            )._M_impl.super__Vector_impl_data._M_finish = psVar10 + -1;
            p_Var9 = psVar10[-1].super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
            }
          }
          std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~vector(&importIssueList);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&issue_1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&importUnitsRefs);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&importUnitsNames);
        }
        if (importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (importedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if (importSourceModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (importSourceModel.
                   super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (importSource.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (importSource.
                   super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    if ((element_type *)0x1 < local_90) {
      NamedEntity::name_abi_cxx11_
                ((string *)&issue_1,
                 (NamedEntity *)
                 model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      plVar14 = (long *)std::__cxx11::string::replace((ulong)&issue_1,0,(char *)0x0,0x2b4469);
      ppbVar29 = &importUnitsRefs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pbVar21 = (pointer)(plVar14 + 2);
      if ((pointer)*plVar14 == pbVar21) {
        importUnitsRefs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar21->_M_dataplus)._M_p;
        importUnitsRefs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar29;
      }
      else {
        importUnitsRefs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar21->_M_dataplus)._M_p;
        importUnitsRefs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar14;
      }
      importUnitsRefs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar14[1];
      *plVar14 = (long)pbVar21;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      plVar14 = (long *)std::__cxx11::string::append((char *)&importUnitsRefs);
      ppbVar1 = &importUnitsNames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pbVar21 = (pointer)(plVar14 + 2);
      if ((pointer)*plVar14 == pbVar21) {
        importUnitsNames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar21->_M_dataplus)._M_p;
        importUnitsNames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
      }
      else {
        importUnitsNames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar21->_M_dataplus)._M_p;
        importUnitsNames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar14;
      }
      importUnitsNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar14[1];
      *plVar14 = (long)pbVar21;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      plVar14 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&importUnitsNames,(ulong)unitsName._M_dataplus._M_p);
      peVar18 = (element_type *)(plVar14 + 2);
      if ((element_type *)*plVar14 == peVar18) {
        local_238._M_allocated_capacity =
             (size_type)(peVar18->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
        local_238._8_8_ = plVar14[3];
        tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_238;
      }
      else {
        local_238._M_allocated_capacity =
             (size_type)(peVar18->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
        tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)*plVar14;
      }
      tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar14[1];
      *plVar14 = (long)peVar18;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      plVar14 = (long *)std::__cxx11::string::append((char *)&tmpUnits);
      names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pbVar21 = (pointer)(plVar14 + 2);
      if ((pointer)*plVar14 == pbVar21) {
        names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar21->_M_dataplus)._M_p;
      }
      else {
        names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar21->_M_dataplus)._M_p;
        names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar14;
      }
      names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar14[1];
      *plVar14 = (long)pbVar21;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          &local_238) {
        operator_delete(tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,(ulong)(local_238._M_allocated_capacity + 1));
      }
      if (importUnitsNames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
        operator_delete(importUnitsNames.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((importUnitsNames.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if (importUnitsRefs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar29) {
        operator_delete(importUnitsRefs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((importUnitsRefs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          &local_1d8) {
        operator_delete(issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,local_1d8._M_allocated_capacity + 1);
      }
      name._M_p = (pointer)&names;
      bVar11 = checkIssuesForDuplications(pVVar26,(string *)name._M_p);
      if (!bVar11) {
        Issue::IssueImpl::create();
        Issue::IssueImpl::setDescription
                  ((IssueImpl *)
                   ((tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,
                   (string *)&names);
        AnyCellmlElement::AnyCellmlElementImpl::setModel
                  (*(AnyCellmlElementImpl **)
                    ((tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl[1].mId.
                    _M_string_length,&model,MODEL);
        bVar11 = ImportedEntity::isImport
                           (&((units_00->
                              super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->super_ImportedEntity);
        RVar13 = UNITS_NAME_UNIQUE;
        if (bVar11) {
          RVar13 = IMPORT_UNITS_NAME_UNIQUE;
        }
        Issue::IssueImpl::setReferenceRule
                  ((IssueImpl *)
                   ((tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,RVar13);
        name._M_p = (pointer)&tmpUnits;
        Logger::LoggerImpl::addIssue(&pVVar26->super_LoggerImpl,(IssuePtr *)name._M_p);
        if (tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if (names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        name._M_p = (pointer)((long)&((names.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1);
        operator_delete(names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,(ulong)name._M_p);
      }
    }
    ppbVar29 = &names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    RVar13 = validateCellmlIdentifier(&unitsName);
    if (RVar13 == UNDEFINED) {
      bVar11 = isStandardUnitName(&unitsName);
      if (bVar11) {
        Issue::IssueImpl::create();
        pIVar6 = (IssueImpl *)
                 (importUnitsNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &tmpUnits,"Units is named \'",&unitsName);
        plVar14 = (long *)std::__cxx11::string::append((char *)&tmpUnits);
        pbVar21 = (pointer)(plVar14 + 2);
        if ((pointer)*plVar14 == pbVar21) {
          names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar21->_M_dataplus)._M_p;
          names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar29;
        }
        else {
          names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar21->_M_dataplus)._M_p;
          names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar14;
        }
        names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar14[1];
        *plVar14 = (long)pbVar21;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        Issue::IssueImpl::setDescription(pIVar6,(string *)&names);
        if (names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar29) {
          operator_delete(names.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((names.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            &local_238) {
          operator_delete(tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,(ulong)(local_238._M_allocated_capacity + 1));
        }
        AnyCellmlElement::AnyCellmlElementImpl::setUnits
                  ((AnyCellmlElementImpl *)
                   **(undefined8 **)
                     ((importUnitsNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_string_length + 0x28),units_00
                  );
        Issue::IssueImpl::setReferenceRule
                  ((IssueImpl *)
                   (importUnitsNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_string_length,UNITS_STANDARD);
        Logger::LoggerImpl::addIssue(&pVVar26->super_LoggerImpl,(IssuePtr *)&importUnitsNames);
        this_00._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             importUnitsNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        goto joined_r0x00273781;
      }
    }
    else {
      makeIssueIllegalIdentifier((ValidatorImpl *)&issue_1,(string *)name._M_p);
      AnyCellmlElement::AnyCellmlElementImpl::setUnits
                ((((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->mPimpl->mItem).
                  super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->mPimpl,units_00);
      bVar11 = ImportedEntity::isImport
                         (&((units_00->
                            super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           )->super_ImportedEntity);
      pIVar6 = (issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl;
      if (bVar11) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &importUnitsNames,"Imported units \'",&unitsName);
        plVar14 = (long *)std::__cxx11::string::append((char *)&importUnitsNames);
        peVar18 = (element_type *)(plVar14 + 2);
        if ((element_type *)*plVar14 == peVar18) {
          local_238._M_allocated_capacity =
               (size_type)
               (peVar18->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
          local_238._8_8_ = plVar14[3];
          tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&local_238;
        }
        else {
          local_238._M_allocated_capacity =
               (size_type)
               (peVar18->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
          tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)*plVar14;
        }
        tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar14[1];
        *plVar14 = (long)peVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        Issue::description_abi_cxx11_
                  ((string *)&importUnitsRefs,
                   issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        pbVar21 = (pointer)((long)&(tmpUnits.
                                    super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base +
                           (long)&(importUnitsRefs.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus);
        uVar25 = (pointer)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            &local_238) {
          uVar25 = local_238._M_allocated_capacity;
        }
        if ((ulong)uVar25 < pbVar21) {
          pbVar24 = (pointer)0xf;
          if (importUnitsRefs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pointer)&importUnitsRefs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            pbVar24 = importUnitsRefs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          if (pbVar24 < pbVar21) goto LAB_0027344f;
          plVar14 = (long *)std::__cxx11::string::replace
                                      ((ulong)&importUnitsRefs,0,(char *)0x0,
                                       (ulong)tmpUnits.
                                              super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr);
        }
        else {
LAB_0027344f:
          plVar14 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&tmpUnits,
                                       (ulong)importUnitsRefs.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
        }
        pbVar21 = (pointer)(plVar14 + 2);
        if ((pointer)*plVar14 == pbVar21) {
          names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar21->_M_dataplus)._M_p;
          names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar29;
        }
        else {
          names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar21->_M_dataplus)._M_p;
          names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar14;
        }
        names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar14[1];
        *plVar14 = (long)pbVar21;
        plVar14[1] = 0;
        *(undefined1 *)&(pbVar21->_M_dataplus)._M_p = 0;
        Issue::IssueImpl::setDescription(pIVar6,(string *)&names);
        pVVar26 = local_1c0;
        units_00 = local_1c8;
        if (names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar29) {
          operator_delete(names.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((names.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
        }
        if (importUnitsRefs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&importUnitsRefs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(importUnitsRefs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((importUnitsRefs.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            &local_238) {
          operator_delete(tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,(ulong)(local_238._M_allocated_capacity + 1));
        }
        if (importUnitsNames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&importUnitsNames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(importUnitsNames.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((importUnitsNames.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
        }
        RVar13 = IMPORT_UNITS_NAME_VALUE;
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &importUnitsNames,"Units \'",&unitsName);
        plVar14 = (long *)std::__cxx11::string::append((char *)&importUnitsNames);
        peVar18 = (element_type *)(plVar14 + 2);
        if ((element_type *)*plVar14 == peVar18) {
          local_238._M_allocated_capacity =
               (size_type)
               (peVar18->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
          local_238._8_8_ = plVar14[3];
          tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&local_238;
        }
        else {
          local_238._M_allocated_capacity =
               (size_type)
               (peVar18->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
          tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)*plVar14;
        }
        tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar14[1];
        *plVar14 = (long)peVar18;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        Issue::description_abi_cxx11_
                  ((string *)&importUnitsRefs,
                   issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        pbVar21 = (pointer)((long)&(tmpUnits.
                                    super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base +
                           (long)&(importUnitsRefs.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus);
        uVar25 = (pointer)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            &local_238) {
          uVar25 = local_238._M_allocated_capacity;
        }
        if ((ulong)uVar25 < pbVar21) {
          pbVar24 = (pointer)0xf;
          if (importUnitsRefs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pointer)&importUnitsRefs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            pbVar24 = importUnitsRefs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          if (pbVar24 < pbVar21) goto LAB_002734d8;
          plVar14 = (long *)std::__cxx11::string::replace
                                      ((ulong)&importUnitsRefs,0,(char *)0x0,
                                       (ulong)tmpUnits.
                                              super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr);
        }
        else {
LAB_002734d8:
          plVar14 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&tmpUnits,
                                       (ulong)importUnitsRefs.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
        }
        pbVar21 = (pointer)(plVar14 + 2);
        if ((pointer)*plVar14 == pbVar21) {
          names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar21->_M_dataplus)._M_p;
          names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar29;
        }
        else {
          names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar21->_M_dataplus)._M_p;
          names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar14;
        }
        names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar14[1];
        *plVar14 = (long)pbVar21;
        plVar14[1] = 0;
        *(undefined1 *)&(pbVar21->_M_dataplus)._M_p = 0;
        Issue::IssueImpl::setDescription(pIVar6,(string *)&names);
        pVVar26 = local_1c0;
        units_00 = local_1c8;
        if (names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar29) {
          operator_delete(names.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((names.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
        }
        if (importUnitsRefs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&importUnitsRefs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(importUnitsRefs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((importUnitsRefs.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            &local_238) {
          operator_delete(tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,(ulong)(local_238._M_allocated_capacity + 1));
        }
        if (importUnitsNames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&importUnitsNames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(importUnitsNames.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((importUnitsNames.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
        }
        RVar13 = UNITS_NAME_VALUE;
      }
      Issue::IssueImpl::setReferenceRule
                ((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl,RVar13);
      Logger::LoggerImpl::addIssue(&pVVar26->super_LoggerImpl,&issue_1);
      this_00 = issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ;
joined_r0x00273781:
      if ((pointer)this_00._M_pi != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      }
    }
    Entity::id_abi_cxx11_
              ((string *)&names,
               (Entity *)
               (units_00->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    bVar11 = isValidXmlName((string *)&names);
    if (names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar29) {
      operator_delete(names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((names.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (!bVar11) {
      Issue::IssueImpl::create();
      Issue::IssueImpl::setReferenceRule
                ((issue_8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl,XML_ID_ATTRIBUTE);
      AnyCellmlElement::AnyCellmlElementImpl::setUnits
                ((((issue_8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->mPimpl->mItem).
                  super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->mPimpl,units_00);
      names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar29;
      std::__cxx11::string::_M_construct<char_const*>((string *)&names,"Units","");
      bVar11 = ImportedEntity::isImport
                         (&((units_00->
                            super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           )->super_ImportedEntity);
      if (bVar11) {
        std::__cxx11::string::_M_replace
                  ((ulong)&names,0,
                   (char *)names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,0x2b63a6);
      }
      pIVar6 = (issue_8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl;
      ppvVar3 = &importIssueList.
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      importIssueList.
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppvVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&importIssueList,
                 names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (long)&((names.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p +
                 (long)&((names.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&importIssueList);
      plVar14 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&importIssueList,(ulong)unitsName._M_dataplus._M_p);
      peVar20 = (element_type *)(plVar14 + 2);
      if ((element_type *)*plVar14 == peVar20) {
        local_1d8._M_allocated_capacity = (size_type)peVar20->_vptr_Issue;
        local_1d8._8_8_ = plVar14[3];
        issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_1d8;
      }
      else {
        local_1d8._M_allocated_capacity = (size_type)peVar20->_vptr_Issue;
        issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)*plVar14;
      }
      issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar14[1];
      *plVar14 = (long)peVar20;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      plVar14 = (long *)std::__cxx11::string::append((char *)&issue_1);
      ppbVar29 = &importUnitsRefs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pbVar21 = (pointer)(plVar14 + 2);
      if ((pointer)*plVar14 == pbVar21) {
        importUnitsRefs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar21->_M_dataplus)._M_p;
        importUnitsRefs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar29;
      }
      else {
        importUnitsRefs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar21->_M_dataplus)._M_p;
        importUnitsRefs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar14;
      }
      importUnitsRefs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar14[1];
      *plVar14 = (long)pbVar21;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      Entity::id_abi_cxx11_
                (&local_118,
                 (Entity *)
                 (local_1c8->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
      pbVar21 = (pointer)((long)&((importUnitsRefs.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p +
                         local_118._M_string_length);
      pbVar24 = (pointer)0xf;
      if (importUnitsRefs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar29) {
        pbVar24 = importUnitsRefs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      if (pbVar24 < pbVar21) {
        uVar25 = (pointer)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          uVar25 = local_118.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar25 < pbVar21) goto LAB_002739b6;
        plVar14 = (long *)std::__cxx11::string::replace
                                    ((ulong)&local_118,0,(char *)0x0,
                                     (ulong)importUnitsRefs.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
      }
      else {
LAB_002739b6:
        plVar14 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&importUnitsRefs,(ulong)local_118._M_dataplus._M_p);
      }
      importUnitsNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&importUnitsNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pbVar21 = (pointer)(plVar14 + 2);
      if ((pointer)*plVar14 == pbVar21) {
        importUnitsNames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar21->_M_dataplus)._M_p;
      }
      else {
        importUnitsNames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar21->_M_dataplus)._M_p;
        importUnitsNames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar14;
      }
      importUnitsNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar14[1];
      *plVar14 = (long)pbVar21;
      plVar14[1] = 0;
      *(undefined1 *)&(pbVar21->_M_dataplus)._M_p = 0;
      plVar14 = (long *)std::__cxx11::string::append((char *)&importUnitsNames);
      peVar18 = (element_type *)(plVar14 + 2);
      if ((element_type *)*plVar14 == peVar18) {
        local_238._M_allocated_capacity =
             (size_type)(peVar18->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
        local_238._8_8_ = plVar14[3];
        tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_238;
      }
      else {
        local_238._M_allocated_capacity =
             (size_type)(peVar18->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
        tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)*plVar14;
      }
      tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar14[1];
      *plVar14 = (long)peVar18;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      Issue::IssueImpl::setDescription(pIVar6,(string *)&tmpUnits);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          &local_238) {
        operator_delete(tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,(ulong)(local_238._M_allocated_capacity + 1));
      }
      if (importUnitsNames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&importUnitsNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(importUnitsNames.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((importUnitsNames.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,
                        (ulong)(local_118.field_2._M_allocated_capacity + 1));
      }
      if (importUnitsRefs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar29) {
        operator_delete(importUnitsRefs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((importUnitsRefs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      pVVar26 = local_1c0;
      units_00 = local_1c8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          &local_1d8) {
        operator_delete(issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,local_1d8._M_allocated_capacity + 1);
      }
      if (importIssueList.
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppvVar3) {
        operator_delete(importIssueList.
                        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((importIssueList.
                                         super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
      Logger::LoggerImpl::addIssue(&pVVar26->super_LoggerImpl,&issue_8);
      if (names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((names.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if (issue_8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (issue_8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    ppbVar29 = &names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    sVar15 = Units::unitCount((units_00->
                              super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr);
    if (sVar15 != 0) {
      std::
      vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
      ::push_back(history,&h);
      for (uVar22 = 0;
          sVar15 = Units::unitCount((units_00->
                                    super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr), uVar22 < sVar15; uVar22 = uVar22 + 1) {
        validateUnitsUnitsItem(pVVar26,uVar22,units_00,history,modelsVisited);
      }
      psVar28 = (history->
                super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      (history->
      super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = psVar28 + -1;
      p_Var9 = psVar28[-1].super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
      }
    }
    names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar29;
    std::__cxx11::string::_M_construct<char_const*>((string *)&names,"Units","");
    tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    handleErrorsFromImports
              (pVVar26,initialErrorCount,(long)psVar7 - (long)psVar8 == 0x10,(string *)&names,
               &unitsName,history,(ComponentPtr *)&tmpUnits,units_00);
    if (tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (tmpUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar29) {
      operator_delete(names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((names.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)unitsImportUrl._M_dataplus._M_p != &unitsImportUrl.field_2) {
      operator_delete(unitsImportUrl._M_dataplus._M_p,
                      CONCAT71(unitsImportUrl.field_2._M_allocated_capacity._1_7_,
                               unitsImportUrl.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)unitsRef._M_dataplus._M_p != &unitsRef.field_2) {
      operator_delete(unitsRef._M_dataplus._M_p,unitsRef.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)unitsName._M_dataplus._M_p == &unitsName.field_2) goto LAB_002722d2;
  }
  operator_delete(unitsName._M_dataplus._M_p,
                  CONCAT71(unitsName.field_2._M_allocated_capacity._1_7_,
                           unitsName.field_2._M_local_buf[0]) + 1);
LAB_002722d2:
  if (h.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (h.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  return;
}

Assistant:

void Validator::ValidatorImpl::validateUnits(const UnitsPtr &units, History &history, std::vector<ModelPtr> &modelsVisited, const std::string &sourceUrl)
{
    auto h = createHistoryEpoch(units, sourceUrl);
    if (checkForLocalCycles(history, h)) {
        history.push_back(h);
        std::string des;
        Strings names;
        for (const auto &entry : history) {
            if (!des.empty()) {
                des += " -> ";
            }
            auto tmp = "'" + entry->mName + "'";
            names.push_back(tmp);
            des += tmp;
        }
        if (!hasCycleAlreadyBeenReported(names)) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Cyclic units exist: " + des + ".");
            issue->mPimpl->mItem->mPimpl->setUnits(units);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNIT_UNITS_CIRCULAR_REFERENCE);
            addIssue(issue);
        }
        history.pop_back();
        return;
    }

    std::string unitsName = units->name();
    size_t initialIssueCount = mValidator->issueCount();
    bool isOriginatingModel = modelsVisited.size() == 1;

    std::string unitsRef;
    std::string unitsImportUrl;
    if (units->isImport()) {
        unitsRef = units->importReference();
        unitsImportUrl = units->importSource()->url();
        h->mReferenceName = unitsRef;
        h->mSourceUrl = importeeModelUrl(history, units->importSource()->url());
    }

    auto model = owningModel(units);

    size_t unitsWithNameCount = 0;
    size_t unitsWithImportSource = 0;
    for (size_t i = 0; (i < model->unitsCount()) && (modelsVisited.size() == 1); ++i) {
        auto tmpUnits = model->units(i);
        if (tmpUnits->name() == unitsName) {
            unitsWithNameCount += 1;
        }
        if (tmpUnits->isImport()) {
            if (tmpUnits->importReference() == unitsRef && tmpUnits->importSource()->url() == unitsImportUrl) {
                unitsWithImportSource += 1;
            }
        }
    }

    if (units->isImport()) {
        // Check for a units_ref.
        size_t currentIssueCount = mValidator->issueCount();
        if (!isCellmlIdentifier(unitsRef)) {
            auto issue = makeIssueIllegalIdentifier(unitsRef);
            issue->mPimpl->setDescription("Imported units '" + unitsName + "' does not have a valid units_ref attribute. " + issue->description());
            issue->mPimpl->mItem->mPimpl->setUnits(units);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_UNITS_UNITS_REFERENCE_VALUE);
            addIssue(issue);
        }

        auto importSource = units->importSource();
        validateImportSource(importSource, unitsName, "units");

        bool foundImportIssue = mValidator->issueCount() > currentIssueCount;

        // Check if we already have another import from the same source with the same units_ref.
        // (This looks for matching entries at the same position in the source and ref vectors).
        if (!foundImportIssue && (unitsWithImportSource > 1)) {
            auto description = "Model '" + model->name() + "' contains multiple imported units from '" + unitsImportUrl + "' with the same units_ref attribute '" + unitsRef + "'.";
            if (!checkIssuesForDuplications(description)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription(description);
                issue->mPimpl->mItem->mPimpl->setModel(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_UNITS_UNITS_REFERENCE);
                addIssue(issue);
            }
        }

        auto importSourceModel = importSource->model();
        if (importSourceModel != nullptr) {
            auto importedUnits = importSourceModel->units(unitsRef);
            if (importedUnits != nullptr) {
                Strings importUnitsNames;
                Strings importUnitsRefs;
                Strings importUnitsImportSources;
                IssuesList importIssueList;

                if (checkForImportCycles(history, h)) {
                    history.push_back(h);
                    auto description = formDescriptionOfCyclicDependency(history, "resolve");
                    IssuePtr issue = Issue::IssueImpl::create();
                    issue->mPimpl->setDescription(description);
                    issue->mPimpl->mItem->mPimpl->setUnits(units);
                    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_UNITS_UNITS_REFERENCE);
                    addIssue(issue);
                } else {
                    modelsVisited.push_back(importSourceModel);
                    history.push_back(h);
                    validateUnits(importedUnits, history, modelsVisited, importSource->url());
                    modelsVisited.pop_back();
                }
            } else {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Imported units '" + units->name() + "' refers to units '" + unitsRef + "' which does not appear in '" + importSource->url() + "'.");
                issue->mPimpl->mItem->mPimpl->setUnits(units);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_UNITS_UNITS_REFERENCE_VALUE_TARGET);
                addIssue(issue);
            }
        }
    }
    // Check for duplicate units names in this model.
    if (unitsWithNameCount > 1) {
        std::string description = "Model '" + model->name() + "' contains multiple units with the name '" + unitsName + "'. Valid units names must be unique to their model.";
        if (!checkIssuesForDuplications(description)) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription(description);
            issue->mPimpl->mItem->mPimpl->setModel(model);
            if (units->isImport()) {
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_UNITS_NAME_UNIQUE);
            } else {
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNITS_NAME_UNIQUE);
            }

            addIssue(issue);
        }
    }
    // Check for a valid name attribute.
    if (!isCellmlIdentifier(unitsName)) {
        auto issue = makeIssueIllegalIdentifier(unitsName);
        issue->mPimpl->mItem->mPimpl->setUnits(units);
        if (units->isImport()) {
            issue->mPimpl->setDescription("Imported units '" + unitsName + "' does not have a valid name attribute. " + issue->description());
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_UNITS_NAME_VALUE);
        } else {
            issue->mPimpl->setDescription("Units '" + unitsName + "' does not have a valid name attribute. " + issue->description());
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNITS_NAME_VALUE);
        }
        addIssue(issue);
    } else {
        // Check for a matching standard units.
        if (isStandardUnitName(unitsName)) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Units is named '" + unitsName + "' which is a protected standard unit name.");
            issue->mPimpl->mItem->mPimpl->setUnits(units);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNITS_STANDARD);
            addIssue(issue);
        }
    }
    // Check for a valid identifier.
    if (!isValidXmlName(units->id())) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ID_ATTRIBUTE);
        issue->mPimpl->mItem->mPimpl->setUnits(units);
        std::string descriptionStart = "Units";
        if (units->isImport()) {
            descriptionStart = "Imported units";
        }
        issue->mPimpl->setDescription(descriptionStart + " '" + unitsName + "' does not have a valid 'id' attribute, '" + units->id() + "'.");
        addIssue(issue);
    }

    if (units->unitCount() > 0) {
        history.push_back(h);
        for (size_t i = 0; i < units->unitCount(); ++i) {
            validateUnitsUnitsItem(i, units, history, modelsVisited);
        }
        history.pop_back();
    }

    handleErrorsFromImports(initialIssueCount, isOriginatingModel, "Units", unitsName, history, nullptr, units);
}